

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O1

void __thiscall QHttpHeaders::removeAll(QHttpHeaders *this,QAnyStringView name)

{
  QHttpHeadersPrivate *pQVar1;
  long in_FS_OFFSET;
  anon_class_1_0_00000001 local_39;
  HeaderName local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1 != (QHttpHeadersPrivate *)0x0) && ((pQVar1->headers).d.size != 0)) {
    HeaderName::HeaderName(&local_38,name);
    QHttpHeadersPrivate::removeAll(&this->d,&local_38);
    if ((long)(char)local_38.data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_index
        != -1) {
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&>
        ::_S_vtable._M_arr
        [(char)local_38.data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_index].
        _M_data)(&local_39,&local_38.data);
      local_38.data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
      super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
      super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
      super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
      super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
      super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_index = 0xff;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpHeaders::removeAll(QAnyStringView name)
{
    if (isEmpty())
        return;

    return QHttpHeadersPrivate::removeAll(d, HeaderName(name));
}